

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int XMLNode_get_children_count(XMLNode *node)

{
  int iVar1;
  long lVar2;
  
  iVar1 = -1;
  if ((node != (XMLNode *)0x0) && (node->init_value == 0x19770522)) {
    if ((long)node->n_children < 1) {
      return 0;
    }
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = (iVar1 + 1) - (uint)(node->children[lVar2]->active == 0);
      lVar2 = lVar2 + 1;
    } while (node->n_children != lVar2);
  }
  return iVar1;
}

Assistant:

int XMLNode_get_children_count(const XMLNode* node)
{
	int i, n;

	CHECK_NODE(node, -1);

	for (i = n = 0; i < node->n_children; i++)
		if (node->children[i]->active)
			n++;
	
	return n;
}